

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsv.c
# Opt level: O1

void update_status(svdir *s)

{
  int iVar1;
  uint uVar2;
  char *__new;
  ulong uVar3;
  char *x4;
  char *fn;
  char *pcVar4;
  char *x6;
  char *fn_00;
  char *fn_01;
  buffer b;
  char status [20];
  char spid [40];
  char bspace [64];
  strerr *se;
  char *local_f8;
  buffer local_e8;
  char local_c8 [12];
  int local_bc;
  byte local_b8;
  undefined1 local_b7;
  byte local_b6;
  undefined1 local_b5;
  char local_a8 [48];
  char local_78 [72];
  
  if (s->islog == 0) {
    fn_01 = "supervise/pid.new";
    pcVar4 = "supervise/pid";
    fn = "supervise/stat.new";
    local_f8 = "supervise/stat";
    fn_00 = "supervise/status.new";
    __new = "supervise/status";
  }
  else {
    fn_01 = "log/supervise/pid.new";
    pcVar4 = "log/supervise/pid";
    fn = "log/supervise/stat.new";
    local_f8 = "log/supervise/stat";
    fn_00 = "log/supervise/status.new";
    __new = "log/supervise/status";
  }
  if (pidchanged != 0) {
    iVar1 = open_trunc(fn_01);
    if (iVar1 == -1) {
      se = &strerr_sys;
      x4 = "unable to open ";
      x6 = ": ";
      fn_00 = fn_01;
      goto LAB_00102892;
    }
    buffer_init(&local_e8,buffer_unixwrite,iVar1,local_78,0x40);
    uVar2 = fmt_ulong(local_a8,(long)s->pid);
    local_a8[uVar2] = '\0';
    if (s->pid != 0) {
      buffer_puts(&local_e8,local_a8);
      buffer_puts(&local_e8,"\n");
      buffer_flush(&local_e8);
    }
    close(iVar1);
    iVar1 = rename(fn_01,pcVar4);
    if (iVar1 == -1) {
      se = &strerr_sys;
      x4 = "unable to rename pid.new to ";
      x6 = ": ";
      fn_00 = pcVar4;
      goto LAB_00102892;
    }
    pidchanged = 0;
  }
  iVar1 = open_trunc(fn);
  if (iVar1 == -1) {
    se = &strerr_sys;
    x4 = "unable to open ";
    x6 = ": ";
    fn_00 = fn;
    goto LAB_00102892;
  }
  buffer_init(&local_e8,buffer_unixwrite,iVar1,local_78,0x40);
  if ((ulong)(uint)s->state < 3) {
    buffer_puts(&local_e8,&DAT_00105064 + *(int *)(&DAT_00105064 + (ulong)(uint)s->state * 4));
  }
  if ((s->ctrl & 2) != 0) {
    buffer_puts(&local_e8,", paused");
  }
  if ((s->ctrl & 1) != 0) {
    buffer_puts(&local_e8,", got TERM");
  }
  if (s->state != 0) {
    if (s->want == 1) {
      pcVar4 = ", want down";
    }
    else {
      if (s->want != 2) goto LAB_00102747;
      pcVar4 = ", want exit";
    }
    buffer_puts(&local_e8,pcVar4);
  }
LAB_00102747:
  buffer_puts(&local_e8,"\n");
  buffer_flush(&local_e8);
  close(iVar1);
  iVar1 = rename(fn,local_f8);
  if (iVar1 == -1) {
    strerr_warn("runsv ",dir,": warning: ","unable to rename stat.new to ",local_f8,": ",&strerr_sys
               );
  }
  taia_pack(local_c8,&s->start);
  local_bc = s->pid;
  local_b6 = (byte)s->ctrl;
  local_b8 = local_b6 >> 1 & 1;
  local_b7 = 100;
  if (s->want == 0) {
    local_b7 = 0x75;
  }
  local_b6 = local_b6 & 1;
  local_b5 = (undefined1)s->state;
  iVar1 = open_trunc(fn_00);
  if (iVar1 == -1) {
    se = &strerr_sys;
    x4 = "unable to open ";
    x6 = ": ";
  }
  else {
    uVar3 = write(iVar1,local_c8,0x14);
    if (uVar3 == 0xffffffffffffffff) {
      strerr_warn("runsv ",dir,": warning: ","unable to write ",fn_00,": ",&strerr_sys);
      close(iVar1);
      unlink(fn_00);
      return;
    }
    close(iVar1);
    if (uVar3 < 0x14) {
      se = (strerr *)0x0;
      x4 = "unable to write ";
      x6 = ": partial write.";
    }
    else {
      iVar1 = rename(fn_00,__new);
      if (iVar1 != -1) {
        return;
      }
      se = &strerr_sys;
      x4 = "unable to rename status.new to ";
      x6 = ": ";
      fn_00 = __new;
    }
  }
LAB_00102892:
  strerr_warn("runsv ",dir,": warning: ",x4,fn_00,x6,se);
  return;
}

Assistant:

void update_status(struct svdir *s) {
  unsigned long l;
  int fd;
  char status[20];
  char bspace[64];
  buffer b;
  char spid[FMT_ULONG];
  char *fstatus ="supervise/status";
  char *fstatusnew ="supervise/status.new";
  char *fstat ="supervise/stat";
  char *fstatnew ="supervise/stat.new";
  char *fpid ="supervise/pid";
  char *fpidnew ="supervise/pid.new";

  if (s->islog) {
    fstatus ="log/supervise/status";
    fstatusnew ="log/supervise/status.new";
    fstat ="log/supervise/stat";
    fstatnew ="log/supervise/stat.new";
    fpid ="log/supervise/pid";
    fpidnew ="log/supervise/pid.new";
  }

  /* pid */
  if (pidchanged) {
    if ((fd =open_trunc(fpidnew)) == -1) {
      warn2("unable to open ", fpidnew);
      return;
    }
    buffer_init(&b, buffer_unixwrite, fd, bspace, sizeof bspace);
    spid[fmt_ulong(spid, (unsigned long)s->pid)] =0;
    if (s->pid) {
      buffer_puts(&b, spid);
      buffer_puts(&b, "\n");
      buffer_flush(&b);
    }
    close(fd);
    if (rename(fpidnew, fpid) == -1) {
      warn2("unable to rename pid.new to ", fpid);
      return;
    }
    pidchanged =0;
  }

  /* stat */
  if ((fd =open_trunc(fstatnew)) == -1) {
    warn2("unable to open ", fstatnew);
    return;
  }
  buffer_init(&b, buffer_unixwrite, fd, bspace, sizeof bspace);
  switch (s->state) {
  case S_DOWN:
    buffer_puts(&b, "down");
    break;
  case S_RUN:
    buffer_puts(&b, "run");
    break;
  case S_FINISH:
    buffer_puts(&b, "finish");
    break;
  }
  if (s->ctrl & C_PAUSE) buffer_puts(&b, ", paused");
  if (s->ctrl & C_TERM) buffer_puts(&b, ", got TERM");
  if (s->state != S_DOWN)
    switch(s->want) {
    case W_DOWN:
      buffer_puts(&b, ", want down");
      break;
    case W_EXIT:
      buffer_puts(&b, ", want exit");
      break;
    }
  buffer_puts(&b, "\n");
  buffer_flush(&b);
  close(fd);
  if (rename(fstatnew, fstat) == -1)
    warn2("unable to rename stat.new to ", fstat);

  /* supervise compatibility */
  taia_pack(status, &s->start);
  l =(unsigned long)s->pid;
  status[12] =l; l >>=8;
  status[13] =l; l >>=8;
  status[14] =l; l >>=8;
  status[15] =l;
  if (s->ctrl & C_PAUSE)
    status[16] =1;
  else
    status[16] =0;
  if (s->want == W_UP)
    status[17] ='u';
  else
    status[17] ='d';
  if (s->ctrl & C_TERM)
    status[18] =1;
  else
    status[18] =0;
  status[19] =s->state;
  if ((fd =open_trunc(fstatusnew)) == -1) {
    warn2("unable to open ", fstatusnew);
    return;
  }
  if ((l =write(fd, status, sizeof status)) == -1) {
    warn2("unable to write ", fstatusnew);
    close(fd);
    unlink(fstatusnew);
    return;
  }
  close(fd);
  if (l < sizeof status) {
    warnx("unable to write ", fstatusnew, ": partial write.");
    return;
  }
  if (rename(fstatusnew, fstatus) == -1)
    warn2("unable to rename status.new to ", fstatus);
}